

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86::forward_fp16s
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  Option *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  bool bVar2;
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 in_stack_fffffffffffffe48;
  int _elempack;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  Mat *this_00;
  int local_168;
  undefined4 local_148;
  int iStack_144;
  Allocator *pAStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  int iStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  int local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Mat local_108;
  int local_bc;
  size_t local_b8;
  int local_b0;
  int local_ac;
  Option *local_a8;
  Mat *local_a0;
  Mat *local_98;
  int local_84;
  Mat *local_80;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  Mat *local_50;
  Mat *local_48;
  Mat *local_38;
  void *local_30;
  Mat *local_20;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  _elempack = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_ac = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  local_a8 = in_RCX;
  local_a0 = in_RDX;
  if (((in_RSI->dims == 2) && (in_RSI->w == local_ac)) && (1 < in_RSI->h * in_RSI->elempack)) {
    local_b0 = in_RSI->h;
    local_b8 = in_RSI->elemsize;
    local_bc = in_RSI->elempack;
    local_98 = in_RSI;
    Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),_elempack,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_48 = local_a0;
    bVar2 = true;
    if (local_a0->data != (void *)0x0) {
      local_20 = local_a0;
      bVar2 = local_a0->cstep * (long)local_a0->c == 0;
    }
    if (bVar2) {
      local_84 = -100;
    }
    else {
      innerproduct_gemm_fp16s_sse
                (local_98,local_a0,(Mat *)(in_RDI + 2),
                 (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x178),
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                 (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8),local_a8);
      local_84 = 0;
    }
  }
  else {
    this_00 = &local_108;
    local_108.data = in_RSI->data;
    local_108.refcount = in_RSI->refcount;
    local_108.allocator = in_RSI->allocator;
    local_108.dims = in_RSI->dims;
    local_108.w = in_RSI->w;
    local_108.h = in_RSI->h;
    local_108.d = in_RSI->d;
    local_108.c = in_RSI->c;
    local_108.cstep = in_RSI->cstep;
    if (local_108.refcount != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_108.refcount;
      *local_108.refcount = *local_108.refcount + 1;
      UNLOCK();
    }
    local_38 = this_00;
    local_8 = this_00;
    if (in_RSI->dims != 1) {
      local_148 = *(undefined4 *)in_RCX;
      iStack_144 = in_RCX->num_threads;
      local_138 = *(undefined4 *)&in_RCX->workspace_allocator;
      uStack_134 = *(undefined4 *)((long)&in_RCX->workspace_allocator + 4);
      iStack_130 = in_RCX->openmp_blocktime;
      uStack_12c._0_1_ = in_RCX->use_winograd_convolution;
      uStack_12c._1_1_ = in_RCX->use_sgemm_convolution;
      uStack_12c._2_1_ = in_RCX->use_int8_inference;
      uStack_12c._3_1_ = in_RCX->use_vulkan_compute;
      local_128._0_1_ = in_RCX->use_bf16_storage;
      local_128._1_1_ = in_RCX->use_fp16_packed;
      local_128._2_1_ = in_RCX->use_fp16_storage;
      local_128._3_1_ = in_RCX->use_fp16_arithmetic;
      uStack_124._0_1_ = in_RCX->use_int8_packed;
      uStack_124._1_1_ = in_RCX->use_int8_storage;
      uStack_124._2_1_ = in_RCX->use_int8_arithmetic;
      uStack_124._3_1_ = in_RCX->use_packing_layout;
      uStack_120._0_1_ = in_RCX->use_shader_pack8;
      uStack_120._1_1_ = in_RCX->use_subgroup_basic;
      uStack_120._2_1_ = in_RCX->use_subgroup_vote;
      uStack_120._3_1_ = in_RCX->use_subgroup_ballot;
      uStack_11c._0_1_ = in_RCX->use_subgroup_shuffle;
      uStack_11c._1_1_ = in_RCX->use_image_storage;
      uStack_11c._2_1_ = in_RCX->use_tensor_storage;
      uStack_11c._3_1_ = in_RCX->use_reserved_0;
      local_118 = in_RCX->flush_denormals;
      uStack_114._0_1_ = in_RCX->use_local_pool_allocator;
      uStack_114._1_1_ = in_RCX->use_shader_local_memory;
      uStack_114._2_1_ = in_RCX->use_cooperative_matrix;
      uStack_114._3_1_ = in_RCX->use_winograd23_convolution;
      uStack_110._0_1_ = in_RCX->use_winograd43_convolution;
      uStack_110._1_1_ = in_RCX->use_winograd63_convolution;
      uStack_110._2_1_ = in_RCX->use_reserved_6;
      uStack_110._3_1_ = in_RCX->use_reserved_7;
      uStack_10c._0_1_ = in_RCX->use_reserved_8;
      uStack_10c._1_1_ = in_RCX->use_reserved_9;
      uStack_10c._2_1_ = in_RCX->use_reserved_10;
      uStack_10c._3_1_ = in_RCX->use_reserved_11;
      pAStack_140 = in_RCX->workspace_allocator;
      (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],in_RSI,&local_108,&local_148);
    }
    local_168 = 1;
    if ((local_a8->use_packing_layout & 1U) != 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
        in_stack_fffffffffffffe54 = 8;
        local_168 = in_stack_fffffffffffffe54;
      }
      else {
        in_stack_fffffffffffffe54 = 1;
        local_168 = in_stack_fffffffffffffe54;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
          in_stack_fffffffffffffe54 = 4;
          local_168 = in_stack_fffffffffffffe54;
        }
      }
    }
    Mat::create(this_00,in_stack_fffffffffffffe5c,
                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),_elempack,
                (Allocator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_50 = local_a0;
    bVar2 = true;
    if (local_a0->data != (void *)0x0) {
      local_18 = local_a0;
      bVar2 = local_a0->cstep * (long)local_a0->c == 0;
    }
    if (bVar2) {
      local_84 = -100;
    }
    else {
      if (local_168 == 8) {
        lVar1 = *(long *)(*in_RDI + -0x18);
        innerproduct_fp16s_pack8_avx
                  (&local_108,local_a0,(Mat *)(in_RDI + 2),(Mat *)((long)in_RDI + lVar1 + 0x178),
                   *(int *)((long)in_RDI + lVar1 + 0xe0),(Mat *)((long)in_RDI + lVar1 + 0xe8),
                   local_a8);
      }
      if (local_168 == 4) {
        lVar1 = *(long *)(*in_RDI + -0x18);
        innerproduct_fp16s_pack4_sse
                  (&local_108,local_a0,(Mat *)(in_RDI + 2),(Mat *)((long)in_RDI + lVar1 + 0x178),
                   *(int *)((long)in_RDI + lVar1 + 0xe0),(Mat *)((long)in_RDI + lVar1 + 0xe8),
                   local_a8);
      }
      if (local_168 == 1) {
        lVar1 = *(long *)(*in_RDI + -0x18);
        innerproduct_fp16s_sse
                  (&local_108,local_a0,(Mat *)(in_RDI + 2),(Mat *)((long)in_RDI + lVar1 + 0x178),
                   *(int *)((long)in_RDI + lVar1 + 0xe0),(Mat *)((long)in_RDI + lVar1 + 0xe8),
                   local_a8);
      }
      local_84 = 0;
    }
    local_80 = &local_108;
    if (local_108.refcount != (int *)0x0) {
      local_5c = 0xffffffff;
      LOCK();
      local_60 = *local_108.refcount;
      *local_108.refcount = *local_108.refcount + -1;
      UNLOCK();
      if (local_60 == 1) {
        local_58 = local_80;
        if (local_108.allocator == (Allocator *)0x0) {
          local_30 = local_108.data;
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])(local_108.allocator,local_108.data);
        }
      }
    }
  }
  return local_84;
}

Assistant:

int InnerProduct_x86::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}